

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::SkipField
               (CodedInputStream *input,uint32 tag,CodedOutputStream *output)

{
  int iVar1;
  undefined4 uVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  int64 iVar7;
  byte *pbVar8;
  uint8 *puVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  byte *pbVar13;
  uint32 first_byte_or_zero;
  ulong uVar14;
  byte bVar15;
  size_t __n;
  pair<unsigned_long,_bool> pVar16;
  string temp;
  string local_50;
  
  if (tag < 8) goto LAB_0027f4d9;
  bVar5 = 0;
  bVar15 = (byte)tag;
  switch(tag & 7) {
  case 0:
    puVar9 = input->buffer_;
    if ((puVar9 < input->buffer_end_) && (uVar14 = (ulong)(char)*puVar9, -1 < (long)uVar14)) {
      input->buffer_ = puVar9 + 1;
      uVar12 = 1;
    }
    else {
      pVar16 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar14 = pVar16.first;
      uVar12 = pVar16._8_4_;
    }
    bVar5 = (byte)uVar12;
    if ((uVar12 & 1) == 0) goto switchD_0027f513_caseD_4;
    if ((output->impl_).end_ <= output->cur_) {
      puVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
      output->cur_ = puVar9;
    }
    pbVar13 = output->cur_;
    if (tag < 0x80) {
      *pbVar13 = bVar15;
      pbVar13 = pbVar13 + 1;
    }
    else {
      *pbVar13 = bVar15 | 0x80;
      if (tag < 0x4000) {
        pbVar13[1] = (byte)(tag >> 7);
        pbVar13 = pbVar13 + 2;
      }
      else {
        pbVar13 = pbVar13 + 2;
        uVar12 = tag >> 7;
        do {
          pbVar8 = pbVar13;
          pbVar8[-1] = (byte)uVar12 | 0x80;
          uVar6 = uVar12 >> 7;
          pbVar13 = pbVar8 + 1;
          bVar4 = 0x3fff < uVar12;
          uVar12 = uVar6;
        } while (bVar4);
        *pbVar8 = (byte)uVar6;
      }
    }
    output->cur_ = pbVar13;
    if ((output->impl_).end_ <= pbVar13) {
      puVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar13);
      output->cur_ = puVar9;
    }
    pbVar13 = output->cur_;
    if (uVar14 < 0x80) {
      *pbVar13 = (byte)uVar14;
      pbVar13 = pbVar13 + 1;
    }
    else {
      *pbVar13 = (byte)uVar14 | 0x80;
      if (uVar14 < 0x4000) {
        pbVar13[1] = (byte)(uVar14 >> 7);
        pbVar13 = pbVar13 + 2;
      }
      else {
        pbVar13 = pbVar13 + 2;
        uVar14 = uVar14 >> 7;
        do {
          pbVar8 = pbVar13;
          pbVar8[-1] = (byte)uVar14 | 0x80;
          uVar11 = uVar14 >> 7;
          pbVar13 = pbVar8 + 1;
          bVar4 = 0x3fff < uVar14;
          uVar14 = uVar11;
        } while (bVar4);
        *pbVar8 = (byte)uVar11;
      }
    }
    break;
  case 1:
    puVar9 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar9 < 8) {
      bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_50);
    }
    else {
      local_50._M_dataplus._M_p = *(pointer *)puVar9;
      input->buffer_ = puVar9 + 8;
      bVar5 = true;
    }
    if ((bool)bVar5 == false) goto switchD_0027f513_caseD_4;
    if ((output->impl_).end_ <= output->cur_) {
      puVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
      output->cur_ = puVar9;
    }
    _Var3._M_p = local_50._M_dataplus._M_p;
    pbVar13 = output->cur_;
    if (tag < 0x80) {
      *pbVar13 = bVar15;
      pbVar13 = pbVar13 + 1;
    }
    else {
      *pbVar13 = bVar15 | 0x80;
      if (tag < 0x4000) {
        pbVar13[1] = (byte)(tag >> 7);
        pbVar13 = pbVar13 + 2;
      }
      else {
        pbVar13 = pbVar13 + 2;
        uVar12 = tag >> 7;
        do {
          pbVar8 = pbVar13;
          pbVar8[-1] = (byte)uVar12 | 0x80;
          uVar6 = uVar12 >> 7;
          pbVar13 = pbVar8 + 1;
          bVar4 = 0x3fff < uVar12;
          uVar12 = uVar6;
        } while (bVar4);
        *pbVar8 = (byte)uVar6;
      }
    }
    output->cur_ = pbVar13;
    if ((output->impl_).end_ <= pbVar13) {
      puVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar13);
      output->cur_ = puVar9;
    }
    puVar9 = output->cur_;
    *(pointer *)puVar9 = _Var3._M_p;
    pbVar13 = puVar9 + 8;
    break;
  case 2:
    pbVar13 = input->buffer_;
    if (pbVar13 < input->buffer_end_) {
      bVar5 = *pbVar13;
      first_byte_or_zero = (uint32)bVar5;
      uVar12 = (uint)bVar5;
      if ((char)bVar5 < '\0') goto LAB_0027f87d;
      input->buffer_ = pbVar13 + 1;
      bVar4 = true;
    }
    else {
      first_byte_or_zero = 0;
LAB_0027f87d:
      iVar7 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
      uVar12 = (uint)iVar7;
      bVar4 = -1 < iVar7;
    }
    if (bVar4) {
      if ((output->impl_).end_ <= output->cur_) {
        puVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
        output->cur_ = puVar9;
      }
      pbVar13 = output->cur_;
      if (tag < 0x80) {
        *pbVar13 = bVar15;
        pbVar13 = pbVar13 + 1;
      }
      else {
        *pbVar13 = bVar15 | 0x80;
        if (tag < 0x4000) {
          pbVar13[1] = (byte)(tag >> 7);
          pbVar13 = pbVar13 + 2;
        }
        else {
          pbVar13 = pbVar13 + 2;
          uVar6 = tag >> 7;
          do {
            pbVar8 = pbVar13;
            pbVar8[-1] = (byte)uVar6 | 0x80;
            uVar10 = uVar6 >> 7;
            pbVar13 = pbVar8 + 1;
            bVar4 = 0x3fff < uVar6;
            uVar6 = uVar10;
          } while (bVar4);
          *pbVar8 = (byte)uVar10;
        }
      }
      output->cur_ = pbVar13;
      if ((output->impl_).end_ <= pbVar13) {
        puVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar13);
        output->cur_ = puVar9;
      }
      pbVar13 = output->cur_;
      if (uVar12 < 0x80) {
        *pbVar13 = (byte)uVar12;
        pbVar13 = pbVar13 + 1;
      }
      else {
        *pbVar13 = (byte)uVar12 | 0x80;
        if (uVar12 < 0x4000) {
          pbVar13[1] = (byte)(uVar12 >> 7);
          pbVar13 = pbVar13 + 2;
        }
        else {
          pbVar13 = pbVar13 + 2;
          uVar6 = uVar12 >> 7;
          do {
            pbVar8 = pbVar13;
            pbVar8[-1] = (byte)uVar6 | 0x80;
            uVar10 = uVar6 >> 7;
            pbVar13 = pbVar8 + 1;
            bVar4 = 0x3fff < uVar6;
            uVar6 = uVar10;
          } while (bVar4);
          *pbVar8 = (byte)uVar10;
        }
      }
      output->cur_ = pbVar13;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      bVar5 = io::CodedInputStream::ReadString(input,&local_50,uVar12);
      if ((bool)bVar5) {
        puVar9 = output->cur_;
        __n = (size_t)(int)local_50._M_string_length;
        if ((long)(output->impl_).end_ - (long)puVar9 < (long)__n) {
          puVar9 = io::EpsCopyOutputStream::WriteRawFallback
                             (&output->impl_,local_50._M_dataplus._M_p,
                              (int)local_50._M_string_length,puVar9);
        }
        else {
          memcpy(puVar9,local_50._M_dataplus._M_p,__n);
          puVar9 = puVar9 + __n;
        }
        output->cur_ = puVar9;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      goto switchD_0027f513_caseD_4;
    }
    goto LAB_0027f4d9;
  case 3:
    if ((output->impl_).end_ <= output->cur_) {
      puVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
      output->cur_ = puVar9;
    }
    pbVar13 = output->cur_;
    if (tag < 0x80) {
      *pbVar13 = bVar15;
      pbVar13 = pbVar13 + 1;
    }
    else {
      *pbVar13 = bVar15 | 0x80;
      if (tag < 0x4000) {
        pbVar13[1] = (byte)(tag >> 7);
        pbVar13 = pbVar13 + 2;
      }
      else {
        pbVar13 = pbVar13 + 2;
        uVar12 = tag >> 7;
        do {
          pbVar8 = pbVar13;
          pbVar8[-1] = (byte)uVar12 | 0x80;
          uVar6 = uVar12 >> 7;
          pbVar13 = pbVar8 + 1;
          bVar4 = 0x3fff < uVar12;
          uVar12 = uVar6;
        } while (bVar4);
        *pbVar8 = (byte)uVar6;
      }
    }
    output->cur_ = pbVar13;
    iVar1 = input->recursion_budget_;
    input->recursion_budget_ = iVar1 + -1;
    if ((0 < iVar1) && (bVar4 = SkipMessage(input,output), bVar4)) {
      if (input->recursion_budget_ < input->recursion_limit_) {
        input->recursion_budget_ = input->recursion_budget_ + 1;
      }
      bVar5 = input->last_tag_ == (tag & 0xfffffff8 | 4);
      goto switchD_0027f513_caseD_4;
    }
LAB_0027f4d9:
    bVar5 = 0;
  default:
    goto switchD_0027f513_caseD_4;
  case 5:
    puVar9 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar9 < 4) {
      bVar5 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_50);
    }
    else {
      local_50._M_dataplus._M_p._0_4_ = *(undefined4 *)puVar9;
      input->buffer_ = puVar9 + 4;
      bVar5 = true;
    }
    if ((bool)bVar5 == false) goto switchD_0027f513_caseD_4;
    if ((output->impl_).end_ <= output->cur_) {
      puVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
      output->cur_ = puVar9;
    }
    pbVar13 = output->cur_;
    if (tag < 0x80) {
      *pbVar13 = bVar15;
      pbVar13 = pbVar13 + 1;
    }
    else {
      *pbVar13 = bVar15 | 0x80;
      if (tag < 0x4000) {
        pbVar13[1] = (byte)(tag >> 7);
        pbVar13 = pbVar13 + 2;
      }
      else {
        pbVar13 = pbVar13 + 2;
        uVar12 = tag >> 7;
        do {
          pbVar8 = pbVar13;
          pbVar8[-1] = (byte)uVar12 | 0x80;
          uVar6 = uVar12 >> 7;
          pbVar13 = pbVar8 + 1;
          bVar4 = 0x3fff < uVar12;
          uVar12 = uVar6;
        } while (bVar4);
        *pbVar8 = (byte)uVar6;
      }
    }
    output->cur_ = pbVar13;
    uVar2 = local_50._M_dataplus._M_p._0_4_;
    if ((output->impl_).end_ <= pbVar13) {
      puVar9 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar13);
      output->cur_ = puVar9;
    }
    puVar9 = output->cur_;
    *(undefined4 *)puVar9 = uVar2;
    pbVar13 = puVar9 + 4;
  }
  output->cur_ = pbVar13;
switchD_0027f513_caseD_4:
  return (bool)(bVar5 & 1);
}

Assistant:

bool WireFormatLite::SkipField(io::CodedInputStream* input, uint32 tag,
                               io::CodedOutputStream* output) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64 value;
      if (!input->ReadVarint64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64 value;
      if (!input->ReadLittleEndian64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32 length;
      if (!input->ReadVarint32(&length)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint32(length);
      // TODO(mkilavuz): Provide API to prevent extra string copying.
      std::string temp;
      if (!input->ReadString(&temp, length)) return false;
      output->WriteString(temp);
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      output->WriteVarint32(tag);
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, output)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32 value;
      if (!input->ReadLittleEndian32(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian32(value);
      return true;
    }
    default: {
      return false;
    }
  }
}